

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getNextNode(ParseContext *pParse,char *z,int n,Fts3Expr **ppExpr,int *pnConsumed)

{
  char c;
  char *__s;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fts3Expr *pFVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  int nStr;
  char *zStr;
  uint local_70;
  int iStack_6c;
  char cNext;
  int nKey;
  int nNear;
  Fts3Keyword *pKey;
  char *pcStack_58;
  int nInput;
  char *zInput;
  Fts3Expr *pRet;
  int rc;
  int iColLen;
  int iCol;
  int ii;
  int *pnConsumed_local;
  Fts3Expr **ppExpr_local;
  int n_local;
  char *z_local;
  ParseContext *pParse_local;
  
  pParse->isNot = 0;
  pKey._4_4_ = n;
  pcStack_58 = z;
  while( true ) {
    bVar8 = false;
    if (0 < pKey._4_4_) {
      iVar2 = fts3isspace(*pcStack_58);
      bVar8 = iVar2 != 0;
    }
    if (!bVar8) break;
    pKey._4_4_ = pKey._4_4_ + -1;
    pcStack_58 = pcStack_58 + 1;
  }
  if (pKey._4_4_ == 0) {
    pParse_local._4_4_ = 0x65;
  }
  else {
    iColLen = 0;
    while( true ) {
      iVar2 = (int)pcStack_58;
      iVar1 = (int)z;
      if (3 < iColLen) break;
      lVar7 = (long)iColLen;
      if (((getNextNode::aKeyword[lVar7].parenOnly == '\0') &&
          ((int)(uint)getNextNode::aKeyword[lVar7].n <= pKey._4_4_)) &&
         (iVar3 = memcmp(pcStack_58,getNextNode::aKeyword[lVar7].z,
                         (ulong)getNextNode::aKeyword[lVar7].n), iVar3 == 0)) {
        iStack_6c = 10;
        local_70 = (uint)getNextNode::aKeyword[lVar7].n;
        if (((getNextNode::aKeyword[lVar7].eType == '\x01') && (pcStack_58[4] == '/')) &&
           (('/' < pcStack_58[5] && (pcStack_58[5] < ':')))) {
          iStack_6c = 0;
          local_70 = 5;
          while( true ) {
            bVar8 = false;
            if ('/' < pcStack_58[(int)local_70]) {
              bVar8 = pcStack_58[(int)local_70] < ':';
            }
            if (!bVar8) break;
            iStack_6c = iStack_6c * 10 + pcStack_58[(int)local_70] + -0x30;
            local_70 = local_70 + 1;
          }
        }
        c = pcStack_58[(int)local_70];
        iVar3 = fts3isspace(c);
        if ((((iVar3 != 0) || (c == '\"')) || (c == '(')) || ((c == ')' || (c == '\0')))) {
          pFVar5 = (Fts3Expr *)fts3MallocZero(0x40);
          if (pFVar5 == (Fts3Expr *)0x0) {
            return 7;
          }
          pFVar5->eType = (uint)getNextNode::aKeyword[lVar7].eType;
          pFVar5->nNear = iStack_6c;
          *ppExpr = pFVar5;
          *pnConsumed = (iVar2 - iVar1) + local_70;
          return 0;
        }
      }
      iColLen = iColLen + 1;
    }
    if (*pcStack_58 == '\"') {
      iColLen = 1;
      while( true ) {
        bVar8 = false;
        if (iColLen < pKey._4_4_) {
          bVar8 = pcStack_58[iColLen] != '\"';
        }
        if (!bVar8) break;
        iColLen = iColLen + 1;
      }
      *pnConsumed = (iVar2 - iVar1) + iColLen + 1;
      if (iColLen == pKey._4_4_) {
        pParse_local._4_4_ = 1;
      }
      else {
        pParse_local._4_4_ = getNextString(pParse,pcStack_58 + 1,iColLen + -1,ppExpr);
      }
    }
    else {
      rc = pParse->iDefaultCol;
      pRet._4_4_ = 0;
      for (iColLen = 0; iColLen < pParse->nCol; iColLen = iColLen + 1) {
        __s = pParse->azCol[iColLen];
        sVar6 = strlen(__s);
        iVar3 = (int)sVar6;
        if (((iVar3 < pKey._4_4_) && (pcStack_58[iVar3] == ':')) &&
           (iVar4 = sqlite3_strnicmp(__s,pcStack_58,iVar3), iVar4 == 0)) {
          rc = iColLen;
          pRet._4_4_ = (iVar2 - iVar1) + iVar3 + 1;
          break;
        }
      }
      pParse_local._4_4_ = getNextToken(pParse,rc,z + pRet._4_4_,n - pRet._4_4_,ppExpr,pnConsumed);
      *pnConsumed = pRet._4_4_ + *pnConsumed;
    }
  }
  return pParse_local._4_4_;
}

Assistant:

static int getNextNode(
  ParseContext *pParse,                   /* fts3 query parse context */
  const char *z, int n,                   /* Input string */
  Fts3Expr **ppExpr,                      /* OUT: expression */
  int *pnConsumed                         /* OUT: Number of bytes consumed */
){
  static const struct Fts3Keyword {
    char *z;                              /* Keyword text */
    unsigned char n;                      /* Length of the keyword */
    unsigned char parenOnly;              /* Only valid in paren mode */
    unsigned char eType;                  /* Keyword code */
  } aKeyword[] = {
    { "OR" ,  2, 0, FTSQUERY_OR   },
    { "AND",  3, 1, FTSQUERY_AND  },
    { "NOT",  3, 1, FTSQUERY_NOT  },
    { "NEAR", 4, 0, FTSQUERY_NEAR }
  };
  int ii;
  int iCol;
  int iColLen;
  int rc;
  Fts3Expr *pRet = 0;

  const char *zInput = z;
  int nInput = n;

  pParse->isNot = 0;

  /* Skip over any whitespace before checking for a keyword, an open or
  ** close bracket, or a quoted string. 
  */
  while( nInput>0 && fts3isspace(*zInput) ){
    nInput--;
    zInput++;
  }
  if( nInput==0 ){
    return SQLITE_DONE;
  }

  /* See if we are dealing with a keyword. */
  for(ii=0; ii<(int)(sizeof(aKeyword)/sizeof(struct Fts3Keyword)); ii++){
    const struct Fts3Keyword *pKey = &aKeyword[ii];

    if( (pKey->parenOnly & ~sqlite3_fts3_enable_parentheses)!=0 ){
      continue;
    }

    if( nInput>=pKey->n && 0==memcmp(zInput, pKey->z, pKey->n) ){
      int nNear = SQLITE_FTS3_DEFAULT_NEAR_PARAM;
      int nKey = pKey->n;
      char cNext;

      /* If this is a "NEAR" keyword, check for an explicit nearness. */
      if( pKey->eType==FTSQUERY_NEAR ){
        assert( nKey==4 );
        if( zInput[4]=='/' && zInput[5]>='0' && zInput[5]<='9' ){
          nNear = 0;
          for(nKey=5; zInput[nKey]>='0' && zInput[nKey]<='9'; nKey++){
            nNear = nNear * 10 + (zInput[nKey] - '0');
          }
        }
      }

      /* At this point this is probably a keyword. But for that to be true,
      ** the next byte must contain either whitespace, an open or close
      ** parenthesis, a quote character, or EOF. 
      */
      cNext = zInput[nKey];
      if( fts3isspace(cNext) 
       || cNext=='"' || cNext=='(' || cNext==')' || cNext==0
      ){
        pRet = (Fts3Expr *)fts3MallocZero(sizeof(Fts3Expr));
        if( !pRet ){
          return SQLITE_NOMEM;
        }
        pRet->eType = pKey->eType;
        pRet->nNear = nNear;
        *ppExpr = pRet;
        *pnConsumed = (int)((zInput - z) + nKey);
        return SQLITE_OK;
      }

      /* Turns out that wasn't a keyword after all. This happens if the
      ** user has supplied a token such as "ORacle". Continue.
      */
    }
  }

  /* See if we are dealing with a quoted phrase. If this is the case, then
  ** search for the closing quote and pass the whole string to getNextString()
  ** for processing. This is easy to do, as fts3 has no syntax for escaping
  ** a quote character embedded in a string.
  */
  if( *zInput=='"' ){
    for(ii=1; ii<nInput && zInput[ii]!='"'; ii++);
    *pnConsumed = (int)((zInput - z) + ii + 1);
    if( ii==nInput ){
      return SQLITE_ERROR;
    }
    return getNextString(pParse, &zInput[1], ii-1, ppExpr);
  }

  if( sqlite3_fts3_enable_parentheses ){
    if( *zInput=='(' ){
      int nConsumed = 0;
      pParse->nNest++;
      rc = fts3ExprParse(pParse, zInput+1, nInput-1, ppExpr, &nConsumed);
      *pnConsumed = (int)(zInput - z) + 1 + nConsumed;
      return rc;
    }else if( *zInput==')' ){
      pParse->nNest--;
      *pnConsumed = (int)((zInput - z) + 1);
      *ppExpr = 0;
      return SQLITE_DONE;
    }
  }

  /* If control flows to this point, this must be a regular token, or 
  ** the end of the input. Read a regular token using the sqlite3_tokenizer
  ** interface. Before doing so, figure out if there is an explicit
  ** column specifier for the token. 
  **
  ** TODO: Strangely, it is not possible to associate a column specifier
  ** with a quoted phrase, only with a single token. Not sure if this was
  ** an implementation artifact or an intentional decision when fts3 was
  ** first implemented. Whichever it was, this module duplicates the 
  ** limitation.
  */
  iCol = pParse->iDefaultCol;
  iColLen = 0;
  for(ii=0; ii<pParse->nCol; ii++){
    const char *zStr = pParse->azCol[ii];
    int nStr = (int)strlen(zStr);
    if( nInput>nStr && zInput[nStr]==':' 
     && sqlite3_strnicmp(zStr, zInput, nStr)==0 
    ){
      iCol = ii;
      iColLen = (int)((zInput - z) + nStr + 1);
      break;
    }
  }
  rc = getNextToken(pParse, iCol, &z[iColLen], n-iColLen, ppExpr, pnConsumed);
  *pnConsumed += iColLen;
  return rc;
}